

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

void __thiscall
capnp::compiler::CompilerMain::ParseErrorCatcher::~ParseErrorCatcher(ParseErrorCatcher *this)

{
  size_t sVar1;
  ProcessContext *pPVar2;
  bool bVar3;
  char *pcVar4;
  char (*params_7) [19];
  String local_48;
  int local_2c;
  char *local_28;
  char *local_20;
  long local_18;
  
  (this->super_ExceptionCallback)._vptr_ExceptionCallback =
       (_func_int **)&PTR__ParseErrorCatcher_0027ab28;
  params_7 = (char (*) [19])0x121968;
  bVar3 = kj::UnwindDetector::isUnwinding(&this->unwindDetector);
  if ((!bVar3) && ((this->exception).ptr.isSet == true)) {
    sVar1 = (this->exception).ptr.field_1.value.description.content.size_;
    if (sVar1 == 0) {
      local_20 = "";
    }
    else {
      local_20 = (this->exception).ptr.field_1.value.description.content.ptr;
    }
    pPVar2 = this->context;
    local_18 = sVar1 + (sVar1 == 0);
    local_28 = (this->exception).ptr.field_1.value.file;
    local_2c = (this->exception).ptr.field_1.value.line;
    kj::
    str<char_const(&)[165],char_const(&)[24],kj::StringPtr,char_const(&)[17],char_const*,char_const(&)[2],int,char_const(&)[19]>
              (&local_48,
               (kj *)
               "*** ERROR CONVERTING PREVIOUS MESSAGE ***\nThe following error occurred while converting the message above.\nThis probably means the input data is invalid/corrupted.\n"
               ,(char (*) [165])"Exception description: ",(char (*) [24])&local_20,
               (StringPtr *)"\nCode location: ",(char (*) [17])&local_28,(char **)0x22b134,
               (char (*) [2])&local_2c,(int *)"\n*** END ERROR ***",params_7);
    pcVar4 = local_48.content.ptr;
    if (local_48.content.size_ == 0) {
      pcVar4 = "";
    }
    (*pPVar2->_vptr_ProcessContext[3])
              (pPVar2,pcVar4,local_48.content.size_ + (local_48.content.size_ == 0));
    sVar1 = local_48.content.size_;
    pcVar4 = local_48.content.ptr;
    if (local_48.content.ptr != (char *)0x0) {
      local_48.content.ptr = (char *)0x0;
      local_48.content.size_ = 0;
      (**(local_48.content.disposer)->_vptr_ArrayDisposer)
                (local_48.content.disposer,pcVar4,1,sVar1,sVar1,0);
    }
  }
  if ((this->exception).ptr.isSet == true) {
    kj::Exception::~Exception(&(this->exception).ptr.field_1.value);
  }
  kj::ExceptionCallback::~ExceptionCallback(&this->super_ExceptionCallback);
  return;
}

Assistant:

~ParseErrorCatcher() noexcept(false) {
      if (!unwindDetector.isUnwinding()) {
        KJ_IF_SOME(e, exception) {
          context.error(kj::str(
              "*** ERROR CONVERTING PREVIOUS MESSAGE ***\n"
              "The following error occurred while converting the message above.\n"
              "This probably means the input data is invalid/corrupted.\n",
              "Exception description: ", e.getDescription(), "\n"
              "Code location: ", e.getFile(), ":", e.getLine(), "\n"
              "*** END ERROR ***"));
        }
      }
    }